

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * __thiscall
MountPoint::translate(string *__return_storage_ptr__,MountPoint *this,string *path)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  iVar2 = std::__cxx11::string::compare
                    ((ulong)path,0,(char *)(this->root).len_,(ulong)(this->root).str_);
  if (iVar2 == 0) {
    std::__cxx11::string::erase((ulong)path,0);
    bVar1 = std::operator==(path,"..");
    if ((!bVar1) &&
       ((path->_M_string_length < 3 ||
        (iVar2 = std::__cxx11::string::compare((ulong)path,0,(char *)0x3), iVar2 != 0)))) {
      StringPiece::AsString_abi_cxx11_(&local_40,&this->mountPoint);
      std::operator+(&local_60,&local_40,"/");
      std::operator+(__return_storage_ptr__,&local_60,path);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string translate(string& path) const {
    // path must be sub dir of root
    if (path.compare(0, root.len_, root.str_, root.len_) != 0) {
      return string();
    }
    path.erase(0, root.len_);
    if (path == ".." || (path.length() > 2 && path.compare(0, 3, "../") == 0)) {
      return string();
    }
    return mountPoint.AsString() + "/" + path;
  }